

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O1

GLvoid __thiscall
gl4cts::anon_unknown_0::GatherBase::CreateTexture2D(GatherBase *this,bool rect,bool base_level)

{
  CallLogWrapper *this_00;
  char cVar1;
  int i;
  GLenum format;
  long lVar2;
  undefined7 in_register_00000011;
  GLenum target;
  undefined7 in_register_00000031;
  size_type __n;
  int level;
  uint uVar3;
  allocator_type local_a5;
  int local_a4;
  int local_a0;
  uint local_9c;
  ulong local_98;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixels;
  Vec4 data [4];
  ulong uVar4;
  
  local_a4 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  format = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])(this);
  local_9c = (uint)CONCAT71(in_register_00000011,base_level);
  uVar3 = local_9c * 0x20 + 0x20;
  uVar4 = (ulong)uVar3;
  local_a0 = (int)CONCAT71(in_register_00000031,rect);
  target = 0xde1;
  if (local_a0 != 0) {
    target = 0x84f5;
  }
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,target,this->tex);
  local_98 = uVar4;
  if (local_a0 == 0) {
    level = 0;
    do {
      uVar3 = (uint)uVar4;
      glu::CallLogWrapper::glTexImage2D
                (this_00,target,level,local_a4,uVar3,uVar3,0,format,0x1406,(void *)0x0);
      level = level + 1;
      uVar4 = uVar4 >> 1;
    } while (1 < uVar3);
  }
  else {
    glu::CallLogWrapper::glTexImage2D
              (this_00,target,0,local_a4,uVar3,uVar3,0,format,0x1406,(void *)0x0);
  }
  uVar3 = local_9c;
  lVar2 = 0;
  do {
    data[0].m_data[lVar2] = 1.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  cVar1 = (char)local_9c;
  __n = 0x400;
  if (cVar1 != '\0') {
    __n = 0x1000;
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&pixels,__n,data,&local_a5);
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,target,0,0,0,(GLsizei)local_98,(GLsizei)local_98,format,0x1406,
             pixels.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  if (format != 0x1902 && (char)local_a0 == '\0') {
    glu::CallLogWrapper::glGenerateMipmap(this_00,target);
  }
  data[0].m_data[0] = 0.75;
  data[0].m_data[1] = 0.8125;
  data[0].m_data[2] = 0.875;
  data[0].m_data[3] = 0.9375;
  data[1].m_data[0] = 0.5;
  data[1].m_data[1] = 0.5625;
  data[1].m_data[2] = 0.625;
  data[1].m_data[3] = 0.6875;
  data[2].m_data[0] = 0.0;
  data[2].m_data[1] = 0.0625;
  data[2].m_data[2] = 0.125;
  data[2].m_data[3] = 0.1875;
  data[3].m_data[0] = 0.25;
  data[3].m_data[1] = 0.3125;
  data[3].m_data[2] = 0.375;
  data[3].m_data[3] = 0.4375;
  uVar3 = uVar3 & 0xff;
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,uVar3,0x16,0x19,2,2,format,0x1406,data);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,uVar3,0x10,10,1,1,format,0x1406,data);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,uVar3,0xb,2,1,1,format,0x1406,data + 1);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,uVar3,0x18,0xd,1,1,format,0x1406,data + 2);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,uVar3,9,0xe,1,1,format,0x1406,data + 3);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x8072,0x812f);
  if (cVar1 != '\0') {
    glu::CallLogWrapper::glTexParameteri(this_00,target,0x813c,1);
  }
  if (pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pixels.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pixels.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pixels.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual GLvoid CreateTexture2D(bool rect = false, bool base_level = false)
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= base_level ? 64 : 32;
		GLint		size			= csize;
		GLenum		target			= rect ? GL_TEXTURE_RECTANGLE : GL_TEXTURE_2D;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		if (!rect)
		{
			for (int i = 0; size > 0; ++i, size /= 2)
			{
				glTexImage2D(target, i, internal_format, size, size, 0, format, GL_FLOAT, 0);
			}
		}
		else
		{
			glTexImage2D(target, 0, internal_format, size, size, 0, format, GL_FLOAT, 0);
		}
		std::vector<Vec4> pixels(csize * csize, Vec4(1.0));
		glTexSubImage2D(target, 0, 0, 0, csize, csize, format, GL_FLOAT, &pixels[0]);

		if (!rect && format != GL_DEPTH_COMPONENT)
		{
			glGenerateMipmap(target);
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		glTexSubImage2D(target, base_level, 22, 25, 2, 2, format, GL_FLOAT, data);
		glTexSubImage2D(target, base_level, 16, 10, 1, 1, format, GL_FLOAT, data + 0);
		glTexSubImage2D(target, base_level, 11, 2, 1, 1, format, GL_FLOAT, data + 1);
		glTexSubImage2D(target, base_level, 24, 13, 1, 1, format, GL_FLOAT, data + 2);
		glTexSubImage2D(target, base_level, 9, 14, 1, 1, format, GL_FLOAT, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (base_level)
			glTexParameteri(target, GL_TEXTURE_BASE_LEVEL, 1);
	}